

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O1

bool __thiscall DataSourceDOS::load(DataSourceDOS *this)

{
  pointer *ppDVar1;
  EndianessMode EVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  iterator iVar5;
  uint *puVar6;
  _func_int **pp_Var7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined4 uVar14;
  undefined1 *puVar15;
  undefined4 *puVar16;
  ulong uVar17;
  uint uVar18;
  anon_union_4_2_7f9ed247 dest;
  PBuffer anim;
  anon_union_4_2_7f9ed247 dest_2;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [36];
  undefined4 local_b4;
  PBuffer local_b0;
  PBuffer local_a0;
  element_type *local_90 [2];
  undefined1 local_80 [48];
  element_type *local_50;
  uint8_t *local_40;
  
  puVar15 = local_e8;
  uStack_f0 = 0x12c2b0;
  iVar11 = (*(this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[5])();
  if ((char)iVar11 == '\0') {
    bVar10 = false;
  }
  else {
    local_d8._0_8_ = (Buffer *)0x0;
    uStack_f0 = 0x12c2d6;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Buffer,std::allocator<Buffer>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(Buffer **)local_d8,
               (allocator<Buffer> *)local_e8,
               &(this->super_DataSourceLegacy).super_DataSourceBase.path);
    uStack_f0 = 0x12c2e6;
    std::__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Buffer,Buffer>
              ((__shared_ptr<Buffer,(__gnu_cxx::_Lock_policy)2> *)local_d8,(Buffer *)local_d8._0_8_)
    ;
    uVar9 = local_d8._8_8_;
    uVar8 = local_d8._0_8_;
    local_d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._8_8_ = (element_type *)0x0;
    p_Var3 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar8;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uStack_f0 = 0x12c303;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      uStack_f0 = 0x12c312;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    uStack_f0 = 0x12c34d;
    UnpackerTPWM::UnpackerTPWM((UnpackerTPWM *)local_d8,&local_a0);
    if (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uStack_f0 = 0x12c35c;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    uStack_f0 = 0x12c369;
    UnpackerTPWM::convert((UnpackerTPWM *)local_e8);
    uVar9 = local_e8._8_8_;
    uVar8 = local_e8._0_8_;
    local_e8._0_8_ = (ostream *)0x0;
    local_e8._8_8_ = (element_type *)0x0;
    p_Var3 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar8;
    (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uStack_f0 = 0x12c386;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
      uStack_f0 = 0x12c395;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
    uStack_f0 = 0x12c3bc;
    local_50 = (element_type *)&stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"data","");
    uStack_f0 = 0x12c3d3;
    Log::Logger::operator[]((Logger *)local_e8,(string *)&Log::Verbose);
    uStack_f0 = 0x12c3e2;
    Log::Stream::operator<<((Stream *)local_e8,"Data file is compressed");
    uStack_f0 = 0x12c3ea;
    Log::Stream::~Stream((Stream *)local_e8);
    if (local_50 != (element_type *)&stack0xffffffffffffffc0) {
      uStack_f0 = 0x12c407;
      operator_delete(local_50,(ulong)(local_40 + 1));
    }
    local_d8._0_8_ = &PTR__Convertor_001571d0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      uStack_f0 = 0x12c422;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._16_8_);
    }
    peVar4 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar12 = *(uint *)peVar4->read;
    peVar4->read = (uint8_t *)((long)peVar4->read + 4);
    if (peVar4->endianess == EndianessBig) {
      local_d8._0_4_ = uVar12;
      lVar13 = 4;
      do {
        *puVar15 = local_e8[lVar13 + 0xf];
        puVar15 = puVar15 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      uVar12 = local_e8._0_4_;
    }
    local_d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._8_8_ = (element_type *)0x0;
    iVar5._M_current =
         (this->entries).
         super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (this->entries).
        super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      uStack_f0 = 0x12c487;
      std::vector<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::
      _M_realloc_insert<DataSourceDOS::DataEntry>(&this->entries,iVar5,(DataEntry *)local_d8);
    }
    else {
      (iVar5._M_current)->offset = 0;
      (iVar5._M_current)->size = 0;
      ppDVar1 = &(this->entries).
                 super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    if ((ulong)uVar12 != 0) {
      uVar17 = 0;
      do {
        peVar4 = (this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        puVar6 = (uint *)peVar4->read;
        uVar18 = *puVar6;
        peVar4->read = (uint8_t *)(puVar6 + 1);
        EVar2 = peVar4->endianess;
        if (EVar2 == EndianessBig) {
          local_d8._0_4_ = uVar18;
          lVar13 = 4;
          puVar15 = local_e8;
          do {
            *puVar15 = local_e8[lVar13 + 0xf];
            puVar15 = puVar15 + 1;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          uVar18 = local_e8._0_4_;
        }
        local_d8._8_8_ = ZEXT48(uVar18);
        uVar14 = puVar6[1];
        peVar4->read = (uint8_t *)(puVar6 + 2);
        if (EVar2 == EndianessBig) {
          local_e8._0_4_ = uVar14;
          lVar13 = 4;
          puVar16 = &local_b4;
          do {
            *(undefined1 *)puVar16 = *(undefined1 *)((long)&uStack_f0 + lVar13 + 7);
            puVar16 = (undefined4 *)((long)puVar16 + 1);
            lVar13 = lVar13 + -1;
            uVar14 = local_b4;
          } while (lVar13 != 0);
        }
        local_d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)uVar14;
        iVar5._M_current =
             (this->entries).
             super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->entries).
            super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          uStack_f0 = 0x12c532;
          std::vector<DataSourceDOS::DataEntry,std::allocator<DataSourceDOS::DataEntry>>::
          _M_realloc_insert<DataSourceDOS::DataEntry_const&>
                    ((vector<DataSourceDOS::DataEntry,std::allocator<DataSourceDOS::DataEntry>> *)
                     &this->entries,iVar5,(DataEntry *)local_d8);
        }
        else {
          (iVar5._M_current)->offset = (size_t)(ulong)(uint)uVar14;
          (iVar5._M_current)->size = local_d8._8_8_;
          ppDVar1 = &(this->entries).
                     super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar12);
    }
    uStack_f0 = 0x12c546;
    fixup(this);
    uStack_f0 = 0x12c55b;
    get_object((DataSourceDOS *)local_d8,(size_t)this);
    *(_Atomic_word *)(local_d8._0_8_ + 0x48) = 0;
    pp_Var7 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._0_8_ + 0x20))->
              _vptr__Sp_counted_base;
    uVar14 = *(undefined4 *)
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._0_8_ + 0x40))->
              _vptr__Sp_counted_base;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._0_8_ + 0x40))->
    _vptr__Sp_counted_base =
         (_func_int **)
         ((long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._0_8_ + 0x40))->
                _vptr__Sp_counted_base + 4);
    local_e8._0_4_ = uVar14;
    lVar13 = 4;
    puVar16 = &local_b4;
    do {
      *(undefined1 *)puVar16 = *(undefined1 *)((long)&uStack_f0 + lVar13 + 7);
      puVar16 = (undefined4 *)((long)puVar16 + 1);
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    if (pp_Var7 == (_func_int **)(ulong)(uint)local_b4) {
      uStack_f0 = 0x12c5a5;
      Buffer::pop_tail((Buffer *)local_e8);
      uVar8 = local_d8._8_8_;
      local_d8._8_8_ = local_e8._8_8_;
      local_d8._0_8_ = local_e8._0_8_;
      local_e8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8._8_8_ = (element_type *)0x0;
      if ((element_type *)uVar8 != (element_type *)0x0) {
        uStack_f0 = 0x12c5c4;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8);
      }
      if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
        uStack_f0 = 0x12c5d3;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      local_b0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_d8._0_8_;
      local_b0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                   super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(((enable_shared_from_this<Buffer> *)(local_d8._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      uStack_f0 = 0x12c675;
      bVar10 = DataSourceLegacy::load_animation_table(&this->super_DataSourceLegacy,&local_b0);
      if ((element_type *)
          local_b0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        uStack_f0 = 0x12c686;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
    }
    else {
      uStack_f0 = 0x12c61e;
      local_90[0] = (element_type *)local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"data","");
      uStack_f0 = 0x12c632;
      Log::Logger::operator[]((Logger *)local_e8,(string *)&Log::Error);
      uStack_f0 = 0x12c641;
      Log::Stream::operator<<((Stream *)local_e8,"Could not extract animation table.");
      uStack_f0 = 0x12c649;
      Log::Stream::~Stream((Stream *)local_e8);
      if (local_90[0] != (element_type *)local_80) {
        uStack_f0 = 0x12c660;
        operator_delete(local_90[0],(ulong)((long)(size_t *)local_80._0_8_ + 1));
      }
      bVar10 = false;
    }
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      uStack_f0 = 0x12c699;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
  return bVar10;
}

Assistant:

bool
DataSourceDOS::load() {
  if (!check()) {
    return false;
  }

  try {
    spae = std::make_shared<Buffer>(path);
  } catch (...) {
    return false;
  }

  // Check that data file is decompressed
  try {
    UnpackerTPWM unpacker(spae);
    spae = unpacker.convert();
    Log::Verbose["data"] << "Data file is compressed";
  }  catch (...) {
    Log::Verbose["data"] << "Data file is not compressed";
  }

  // Read the number of entries in the index table.
  // Some entries are undefined (size and offset are zero).
  size_t entry_count = spae->pop<uint32_t>();
  entries.push_back({0, 0});  // first entry is whole file itself, drop it
  for (size_t i = 0; i < entry_count; i++) {
    DataEntry entry;
    entry.size = spae->pop<uint32_t>();
    entry.offset = spae->pop<uint32_t>();
    entries.push_back(entry);
  }

  fixup();

  // The first uint32 is the byte length of the rest
  // of the table in big endian order.
  PBuffer anim = get_object(DATA_SERF_ANIMATION_TABLE);
  anim->set_endianess(Buffer::EndianessBig);
  size_t size = anim->get_size();
  if (size != anim->pop<uint32_t>()) {
    Log::Error["data"] << "Could not extract animation table.";
    return false;
  }
  anim = anim->pop_tail();

  return load_animation_table(anim);
}